

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O0

void __thiscall
TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
::AddKel(TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
         *this,TPZFMatrix<std::complex<float>_> *elmat,TPZVec<long> *destinationindex)

{
  DecomposeType DVar1;
  void *mineq_00;
  int64_t iVar2;
  TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *this_00;
  TPZBaseMatrix *in_RDI;
  lock_guard<std::mutex> lock;
  TPZEqnArray<std::complex<float>_> *AuxEqn;
  int64_t maxeq;
  int64_t mineq;
  mutex_type *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffff98;
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  *in_stack_ffffffffffffffa0;
  int64_t *in_stack_ffffffffffffffa8;
  TPZVec<long> *in_stack_ffffffffffffffb8;
  TPZEqnArray<std::complex<float>_> *in_stack_ffffffffffffffc0;
  TPZFMatrix<std::complex<float>_> *in_stack_ffffffffffffffc8;
  TPZFrontSym<std::complex<float>_> *in_stack_ffffffffffffffd0;
  long local_28;
  long local_20;
  
  TPZFrontSym<std::complex<float>_>::AddKel
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
             (TPZVec<long> *)in_stack_ffffffffffffffc0);
  TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
  ::EquationsToDecompose
            ((TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(int64_t *)in_RDI,
             in_stack_ffffffffffffffa8);
  if (local_20 <= local_28) {
    mineq_00 = operator_new(0x3290);
    TPZEqnArray<std::complex<float>_>::TPZEqnArray(in_stack_ffffffffffffffc0);
    TPZFrontSym<std::complex<float>_>::DecomposeEquations
              ((TPZFrontSym<std::complex<float>_> *)in_RDI,(int64_t)mineq_00,
               (int64_t)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    TPZFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
    ::CheckCompress(in_stack_ffffffffffffffa0);
    std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    TPZStack<TPZEqnArray<std::complex<float>_>_*,_10>::Push
              ((TPZStack<TPZEqnArray<std::complex<float>_>_*,_10> *)in_stack_ffffffffffffffa0,
               in_stack_ffffffffffffff98);
    iVar2 = TPZBaseMatrix::Rows(in_RDI);
    if (local_28 == iVar2 + -1) {
      this_00 = (TPZParFrontMatrix<std::complex<float>,_TPZFileEqnStorage<std::complex<float>_>,_TPZFrontSym<std::complex<float>_>_>
                 *)std::operator<<((ostream *)&std::cout,"Decomposition finished");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::ostream::flush();
      FinishWriting(this_00);
    }
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1d44a98);
    std::condition_variable::notify_all();
  }
  DVar1 = TPZFrontSym<std::complex<float>_>::GetDecomposeType
                    ((TPZFrontSym<std::complex<float>_> *)&in_RDI[6].fDecomposed);
  in_RDI->fDecomposed = (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}